

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ValidateJsonNameConflictProto2_Test::
TestBody(ValidationErrorTest_ValidateJsonNameConflictProto2_Test *this)

{
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  ValidationErrorTest_ValidateJsonNameConflictProto2_Test *local_10;
  ValidationErrorTest_ValidateJsonNameConflictProto2_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "name: \'foo.proto\' syntax: \'proto2\' message_type {  name: \'Foo\'  field { name:\'AB\' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 }  field { name:\'_a__b_\' number:2 label:LABEL_OPTIONAL type:TYPE_INT32 }}"
             ,&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "foo.proto: Foo: NAME: The default JSON name of field \"_a__b_\" (\"AB\") conflicts with the default JSON name of field \"AB\".\n"
             ,&local_69);
  ValidationErrorTest::BuildFileWithWarnings(&this->super_ValidationErrorTest,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ValidateJsonNameConflictProto2) {
  BuildFileWithWarnings(
      "name: 'foo.proto' "
      "syntax: 'proto2' "
      "message_type {"
      "  name: 'Foo'"
      "  field { name:'AB' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 }"
      "  field { name:'_a__b_' number:2 label:LABEL_OPTIONAL type:TYPE_INT32 }"
      "}",
      "foo.proto: Foo: NAME: The default JSON name of field \"_a__b_\" "
      "(\"AB\") "
      "conflicts with the default JSON name of field \"AB\".\n");
}